

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinylogger.h
# Opt level: O1

void __thiscall
tlog::Logger::progress<std::chrono::duration<long,std::ratio<1l,1000000l>>>
          (Logger *this,uint64_t current,uint64_t total,
          duration<long,_std::ratio<1L,_1000000L>_> duration)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  
  p_Var1 = &(this->mHiddenSeverities)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = (this->mHiddenSeverities)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var1->_M_header;
  for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < 6]) {
    if (5 < (int)p_Var2[1]._M_color) {
      p_Var3 = p_Var2;
    }
  }
  p_Var2 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) && (p_Var2 = p_Var3, 6 < (int)p_Var3[1]._M_color)) {
    p_Var2 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var2 == p_Var1) {
    p_Var2 = (this->mOutputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->mOutputs)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var2 != p_Var1) {
      do {
        (**(code **)(**(long **)(p_Var2 + 1) + 8))
                  (*(long **)(p_Var2 + 1),&this->mScope,current,total,duration.__r);
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      } while ((_Rb_tree_header *)p_Var2 != p_Var1);
    }
  }
  return;
}

Assistant:

void progress(uint64_t current, uint64_t total, T duration) {
            if (mHiddenSeverities.count(ESeverity::Progress)) {
                return;
            }

            duration_t dur = std::chrono::duration_cast<duration_t>(duration);
            for (auto& output : mOutputs) {
                output->writeProgress(mScope, current, total, dur);
            }
        }